

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall
CLI::detail::ExistingDirectoryValidator::ExistingDirectoryValidator
          (ExistingDirectoryValidator *this)

{
  anon_class_1_0_00000001 local_45 [20];
  allocator local_31;
  string local_30;
  ExistingDirectoryValidator *local_10;
  ExistingDirectoryValidator *this_local;
  
  local_10 = this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_30,"DIR",&local_31);
  Validator::Validator(&this->super_Validator,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_31);
  ::std::function<std::__cxx11::string(std::__cxx11::string&)>::operator=
            ((function<std::__cxx11::string(std::__cxx11::string&)> *)&(this->super_Validator).func_
             ,local_45);
  return;
}

Assistant:

ExistingDirectoryValidator() : Validator("DIR") {
        func_ = [](std::string &filename) {
            auto path_result = check_path(filename.c_str());
            if(path_result == path_type::nonexistant) {
                return "Directory does not exist: " + filename;
            }
            if(path_result == path_type::file) {
                return "Directory is actually a file: " + filename;
            }
            return std::string();
        };
    }